

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O1

bool __thiscall
ON_OBSOLETE_V5_DimLinear::Write(ON_OBSOLETE_V5_DimLinear *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  bool bVar4;
  
  iVar3 = ON_BinaryArchive::Archive3dmVersion(archive);
  bVar1 = true;
  if ((4 < iVar3) && (bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x40008000,1,0), !bVar1))
  {
    return false;
  }
  if (bVar1 != false) {
    bVar1 = ON_OBSOLETE_V5_Annotation::Write(&this->super_ON_OBSOLETE_V5_Annotation,archive);
  }
  bVar4 = bVar1;
  if (4 < iVar3) {
    bVar2 = ON_BinaryArchive::EndWrite3dmChunk(archive);
    bVar4 = false;
    if (bVar2) {
      bVar4 = bVar1;
    }
  }
  return bVar4;
}

Assistant:

bool ON_OBSOLETE_V5_DimLinear::Write(ON_BinaryArchive& archive) const
{
  // 18 October 2007 Dale Lear
  //    I added the chunk wrapping so V5 and future versions can
  //    add IO support for information specific to ON_OBSOLETE_V5_DimLinear
  //    V4 did not have a ON_OBSOLETE_V5_DimLinear::Write and simply called
  //    ON_OBSOLETE_V5_Annotation::Write.
  bool rc = false;
  bool bInChunk = (archive.Archive3dmVersion() >= 5);
  if ( bInChunk )
  {
    rc = archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,0);
    if ( !rc )
      return false;
  }
  else
  {
    rc = true;
  }

  while(rc)
  {
    rc = ON_OBSOLETE_V5_Annotation::Write(archive)?true:false;
    if (!rc) break;
    if ( !bInChunk )
      break;

    // To write new fields, increment minor version number
    // and write values here.  Ask Dale Lear for help.

    break;
  }

  if ( bInChunk )
  {
    if (!archive.EndWrite3dmChunk())
      rc = false;
  }
  return rc;
}